

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOrValue * __thiscall
kj::_::ExceptionOrValue::operator=(ExceptionOrValue *this,ExceptionOrValue *other)

{
  ExceptionOrValue *other_local;
  ExceptionOrValue *this_local;
  
  Maybe<kj::Exception>::operator=(&this->exception,&other->exception);
  return this;
}

Assistant:

ExceptionOrValue& operator=(ExceptionOrValue&& other) = default;